

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O0

int CompareFontTables(TestCase *ptcase,GrcRtFileFont *pfontBmark,GrcRtFileFont *pfontTest)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  fontTableId32 fVar5;
  fontTableId32 fVar6;
  int *ec_00;
  byte *pNameTblB_00;
  GrIStream *in_RDX;
  GrIStream *in_RSI;
  TestCase *in_RDI;
  GrBufferIStream grstrmGlocT;
  GrBufferIStream grstrmGlatT;
  GrBufferIStream grstrmGlocB;
  GrBufferIStream grstrmGlatB;
  int ecBogus;
  int chwMaxGlyphID;
  GrBufferIStream grstrmT;
  GrBufferIStream grstrmB;
  int *in_stack_00000958;
  GrIStream *in_stack_00000960;
  GrIStream *in_stack_00000968;
  TestCase *in_stack_00000970;
  int *in_stack_00000978;
  size_t cbSillSzT;
  size_t cbNameSzT;
  size_t cbGlocSzT;
  size_t cbGlatSzT;
  size_t cbFeatSzT;
  size_t cbSilfSzT;
  size_t cbCmapSzT;
  size_t cbHeadSzT;
  byte *pSillTblT;
  byte *pNameTblT;
  byte *pGlocTblT;
  byte *pGlatTblT;
  byte *pFeatTblT;
  byte *pSilfTblT;
  byte *pSileTblT;
  byte *pCmapTblT;
  byte *pHeadTblT;
  size_t cbSillSzB;
  size_t cbNameSzB;
  size_t cbGlocSzB;
  size_t cbGlatSzB;
  size_t cbFeatSzB;
  size_t cbSilfSzB;
  size_t cbCmapSzB;
  size_t cbHeadSzB;
  byte *pSillTblB;
  byte *pNameTblB;
  byte *pGlocTblB;
  byte *pGlatTblB;
  byte *pFeatTblB;
  byte *pSilfTblB;
  byte *pSileTblB;
  byte *pCmapTblB;
  byte *pHeadTblB;
  int ec;
  GrBufferIStream *in_stack_fffffffffffff2e0;
  size_t *in_stack_fffffffffffff300;
  undefined8 in_stack_fffffffffffff308;
  fontTableId32 tableID;
  GrcRtFileFont *in_stack_fffffffffffff310;
  undefined8 in_stack_fffffffffffff358;
  int i;
  string *in_stack_fffffffffffff360;
  TestCase *in_stack_fffffffffffff368;
  int *in_stack_fffffffffffff370;
  allocator *errCnt;
  TestCase *in_stack_fffffffffffff578;
  allocator *in_stack_fffffffffffff580;
  TestCase *in_stack_fffffffffffff588;
  allocator *in_stack_fffffffffffff590;
  allocator *in_stack_fffffffffffff638;
  GrIStream *grstrmT_00;
  undefined4 in_stack_fffffffffffff650;
  TestCase *in_stack_fffffffffffff658;
  int *in_stack_fffffffffffff660;
  GrIStream *in_stack_fffffffffffff698;
  GrIStream *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  fontTableId32 in_stack_fffffffffffff6ac;
  undefined8 in_stack_fffffffffffff6b0;
  TestCase *pTVar7;
  int wMaxGlyphID;
  allocator *in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6d0;
  GrBufferIStream local_878;
  GrBufferIStream local_858;
  GrBufferIStream local_838;
  GrBufferIStream local_818;
  allocator local_7f1;
  string local_7f0 [36];
  int local_7cc;
  GrBufferIStream local_7c8;
  GrBufferIStream local_7a8 [3];
  allocator local_731;
  string local_730 [119];
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [119];
  allocator local_5f1;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [119];
  allocator local_529;
  string local_528 [39];
  allocator local_501;
  string local_500 [39];
  allocator local_4d9;
  string local_4d8 [119];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [119];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [119];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [119];
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  allocator local_169;
  string local_168 [48];
  int local_138;
  undefined4 uStack_134;
  long local_130;
  int local_128;
  int local_120;
  undefined4 uStack_11c;
  int local_118;
  undefined4 uStack_114;
  int local_110;
  undefined4 uStack_10c;
  long local_108;
  long local_100;
  byte *local_f8;
  void *local_f0;
  byte *local_e8;
  byte *local_e0;
  byte *local_d8;
  byte *local_d0;
  undefined8 local_c8;
  GrIStream *local_c0;
  void *local_b8;
  int local_b0;
  undefined4 uStack_ac;
  long local_a8;
  int local_a0;
  int local_98;
  undefined4 uStack_94;
  int local_90;
  undefined4 uStack_8c;
  int local_88;
  undefined4 uStack_84;
  long local_80;
  long local_78;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  byte *local_58;
  byte *local_50;
  byte *local_48;
  undefined8 local_40;
  int *local_38;
  void *local_30;
  int local_24;
  GrIStream *local_20;
  GrIStream *local_18;
  TestCase *local_10;
  int local_4;
  
  wMaxGlyphID = (int)((ulong)in_stack_fffffffffffff6b0 >> 0x20);
  i = (int)((ulong)in_stack_fffffffffffff358 >> 0x20);
  tableID = (fontTableId32)((ulong)in_stack_fffffffffffff308 >> 0x20);
  local_24 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TtfUtil::TableIdTag(ktiHead);
  local_30 = GrcRtFileFont::getTable(in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (local_30 == (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"ERROR: benchmark font has empty head table",&local_169);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  else {
    TtfUtil::TableIdTag(ktiHead);
    local_b8 = GrcRtFileFont::getTable(in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_b8 == (void *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"ERROR: test font has empty head table",&local_191);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
    }
    else {
      if (local_78 != local_100) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,"ERROR: size of head tables do not match",&local_1b9)
        ;
        OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i)
        ;
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      iVar3 = TtfUtil::DesignUnits(in_stack_fffffffffffff2e0);
      iVar4 = TtfUtil::DesignUnits(in_stack_fffffffffffff2e0);
      if (iVar3 != iVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e0,"ERROR: design units do not match",&local_1e1);
        OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i)
        ;
        std::__cxx11::string::~string(local_1e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      }
      bVar1 = TtfUtil::IsItalic(in_stack_fffffffffffff2e0);
      bVar2 = TtfUtil::IsItalic(in_stack_fffffffffffff2e0);
      if (bVar1 != bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_208,"ERROR: italic flags do not match",&local_209);
        OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i)
        ;
        std::__cxx11::string::~string(local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
      }
    }
  }
  local_40 = 0;
  local_c8 = 0;
  fVar5 = TtfUtil::TableIdTag(ktiCmap);
  ec_00 = (int *)GrcRtFileFont::getTable
                           (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  local_38 = ec_00;
  if (ec_00 == (int *)0x0) {
    in_stack_fffffffffffff6b8 = &local_281;
    pTVar7 = local_10;
    std::allocator<char>::allocator();
    wMaxGlyphID = (int)((ulong)pTVar7 >> 0x20);
    std::__cxx11::string::string
              (local_280,"ERROR: benchmark font has empty cmap table",in_stack_fffffffffffff6b8);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  else {
    in_stack_fffffffffffff6ac = TtfUtil::TableIdTag(ktiCmap);
    in_stack_fffffffffffff698 =
         (GrIStream *)
         GrcRtFileFont::getTable(in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    local_c0 = in_stack_fffffffffffff698;
    if (local_b8 == (void *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"ERROR: test font has empty cmap table",&local_2a9);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      in_stack_fffffffffffff6a0 = local_20;
    }
    else {
      in_stack_fffffffffffff6a0 = local_20;
      if (local_80 != local_108) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2d0,"ERROR: size of cmap tables do not match",&local_2d1)
        ;
        OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i)
        ;
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        in_stack_fffffffffffff6a0 = local_20;
      }
    }
  }
  fVar6 = TtfUtil::TableIdTag(ktiName);
  pNameTblB_00 = (byte *)GrcRtFileFont::getTable
                                   (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  local_68 = pNameTblB_00;
  if (pNameTblB_00 == (byte *)0x0) {
    in_stack_fffffffffffff638 = &local_349;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_348,"ERROR: benchmark font has empty name table",in_stack_fffffffffffff638);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    grstrmT_00 = local_18;
  }
  else {
    TtfUtil::TableIdTag(ktiName);
    local_f0 = GrcRtFileFont::getTable(in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_f0 == (void *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_370,"ERROR: test font has empty name table",&local_371);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator((allocator<char> *)&local_371);
      grstrmT_00 = local_18;
    }
    else {
      grstrmT_00 = local_18;
      if (local_a8 != local_130) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_398,"ERROR: size of name tables do not match",&local_399)
        ;
        OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i)
        ;
        std::__cxx11::string::~string(local_398);
        std::allocator<char>::~allocator((allocator<char> *)&local_399);
        grstrmT_00 = local_18;
      }
    }
  }
  local_d0 = (byte *)0x0;
  TtfUtil::TableIdTag(ktiSilf);
  local_48 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (local_48 == (byte *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_410,"ERROR: benchmark font has empty Silf table",&local_411);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator((allocator<char> *)&local_411);
  }
  else {
    TtfUtil::TableIdTag(ktiSilf);
    local_d0 = (byte *)GrcRtFileFont::getTable
                                 (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_d0 == (byte *)0x0) {
      in_stack_fffffffffffff590 = &local_439;
      in_stack_fffffffffffff588 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_438,"ERROR: test font has empty Silf table",in_stack_fffffffffffff590);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_438);
      std::allocator<char>::~allocator((allocator<char> *)&local_439);
    }
    else if (CONCAT44(uStack_84,local_88) != CONCAT44(uStack_10c,local_110)) {
      in_stack_fffffffffffff580 = &local_461;
      in_stack_fffffffffffff578 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_460,"ERROR: size of Silf tables do not match",in_stack_fffffffffffff580);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
    }
  }
  TtfUtil::TableIdTag(ktiFeat);
  local_50 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (local_50 == (byte *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d8,"ERROR: benchmark font has empty Feat table",&local_4d9);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  }
  else {
    TtfUtil::TableIdTag(ktiFeat);
    local_d8 = (byte *)GrcRtFileFont::getTable
                                 (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_d8 == (byte *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_500,"ERROR: test font has empty Feat table",&local_501);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_500);
      std::allocator<char>::~allocator((allocator<char> *)&local_501);
    }
    else if (CONCAT44(uStack_8c,local_90) != CONCAT44(uStack_114,local_118)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_528,"ERROR: size of Feat tables do not match",&local_529);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_528);
      std::allocator<char>::~allocator((allocator<char> *)&local_529);
    }
  }
  TtfUtil::TableIdTag(ktiGlat);
  local_58 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (local_58 == (byte *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5a0,"ERROR: benchmark font has empty Glat table",&local_5a1);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  }
  else {
    TtfUtil::TableIdTag(ktiGlat);
    local_e0 = (byte *)GrcRtFileFont::getTable
                                 (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_e0 == (byte *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,"ERROR: test font has empty Glat table",&local_5c9);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    }
    else if (CONCAT44(uStack_94,local_98) != CONCAT44(uStack_11c,local_120)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5f0,"ERROR: size of Glat tables do not match",&local_5f1);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_5f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
    }
  }
  TtfUtil::TableIdTag(ktiGloc);
  local_60 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (local_60 == (byte *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_668,"ERROR: benchmark font has empty Gloc table",&local_669);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_668);
    std::allocator<char>::~allocator((allocator<char> *)&local_669);
  }
  else {
    TtfUtil::TableIdTag(ktiGloc);
    local_e8 = (byte *)GrcRtFileFont::getTable
                                 (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
    if (local_e8 == (byte *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_690,"ERROR: test font has empty Gloc table",&local_691);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_690);
      std::allocator<char>::~allocator((allocator<char> *)&local_691);
    }
    else if (CONCAT44(uStack_94,local_98) != CONCAT44(uStack_11c,local_120)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6b8,"ERROR: size of Gloc tables do not match",&local_6b9);
      OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    }
  }
  TtfUtil::TableIdTag(ktiSill);
  local_70 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  TtfUtil::TableIdTag(ktiSill);
  local_f8 = (byte *)GrcRtFileFont::getTable
                               (in_stack_fffffffffffff310,tableID,in_stack_fffffffffffff300);
  if (CONCAT44(uStack_ac,local_b0) != CONCAT44(uStack_134,local_138)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"ERROR: size of Sill tables do not match",&local_731);
    OutputError(in_stack_fffffffffffff370,in_stack_fffffffffffff368,in_stack_fffffffffffff360,i);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
  }
  if (local_d0 == (byte *)0x0) {
    local_4 = local_24;
  }
  else {
    gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
    gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
    gr::GrBufferIStream::OpenBuffer(local_7a8,local_48,local_88);
    gr::GrBufferIStream::OpenBuffer(&local_7c8,local_d0,local_110);
    CompareSilfTables(in_stack_00000978,in_stack_00000970,in_stack_00000968,in_stack_00000960,
                      in_stack_00000958);
    gr::GrBufferIStream::Close(local_7a8);
    gr::GrBufferIStream::Close(&local_7c8);
    if (local_7cc == -1) {
      errCnt = &local_7f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_7f0,"[Skipping Gloc and Glat tables since max glyph IDs do not match]",errCnt
                );
      OutputError((int *)errCnt,local_10,in_stack_fffffffffffff360,i);
      std::__cxx11::string::~string(local_7f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
    }
    else if ((((local_58 != (byte *)0x0) && (local_60 != (byte *)0x0)) && (local_e0 != (byte *)0x0))
            && (local_e8 != (byte *)0x0)) {
      gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::OpenBuffer(&local_818,local_58,local_98);
      gr::GrBufferIStream::OpenBuffer(&local_838,local_60,local_a0);
      gr::GrBufferIStream::OpenBuffer(&local_858,local_e0,local_120);
      gr::GrBufferIStream::OpenBuffer(&local_878,local_e8,local_128);
      CompareGlatAndGlocTables
                (ec_00,(TestCase *)in_stack_fffffffffffff6b8,wMaxGlyphID,
                 (GrIStream *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                 (GrIStream *)CONCAT44(fVar5,in_stack_fffffffffffff6d0));
      gr::GrBufferIStream::Close(&local_818);
      gr::GrBufferIStream::Close(&local_838);
      gr::GrBufferIStream::Close(&local_858);
      gr::GrBufferIStream::Close(&local_878);
      gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
      gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
    }
    if ((local_50 != (byte *)0x0) && (local_d8 != (byte *)0x0)) {
      gr::GrBufferIStream::OpenBuffer(local_7a8,local_50,local_90);
      gr::GrBufferIStream::OpenBuffer(&local_7c8,local_d8,local_118);
      CompareFeatTables(in_stack_fffffffffffff660,in_stack_fffffffffffff658,
                        (GrIStream *)CONCAT44(fVar6,in_stack_fffffffffffff650),grstrmT_00,
                        pNameTblB_00,(byte *)in_stack_fffffffffffff638);
      gr::GrBufferIStream::Close(local_7a8);
      gr::GrBufferIStream::Close(&local_7c8);
    }
    if ((local_70 != (byte *)0x0) && (local_f8 != (byte *)0x0)) {
      gr::GrBufferIStream::OpenBuffer(local_7a8,local_70,local_b0);
      gr::GrBufferIStream::OpenBuffer(&local_7c8,local_f8,local_138);
      CompareSillTables((int *)in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                        (GrIStream *)in_stack_fffffffffffff580,
                        (GrIStream *)in_stack_fffffffffffff578);
      gr::GrBufferIStream::Close(local_7a8);
      gr::GrBufferIStream::Close(&local_7c8);
    }
    if (local_30 != (void *)0x0) {
      operator_delete__(local_30);
    }
    if (local_b8 != (void *)0x0) {
      operator_delete__(local_b8);
    }
    if (local_38 != (int *)0x0) {
      operator_delete__(local_38);
    }
    if (local_c0 != (GrIStream *)0x0) {
      operator_delete__(local_c0);
    }
    if (local_68 != (byte *)0x0) {
      operator_delete__(local_68);
    }
    if (local_f0 != (void *)0x0) {
      operator_delete__(local_f0);
    }
    if (local_48 != (byte *)0x0) {
      operator_delete__(local_48);
    }
    if (local_d0 != (byte *)0x0) {
      operator_delete__(local_d0);
    }
    if (local_50 != (byte *)0x0) {
      operator_delete__(local_50);
    }
    if (local_d8 != (byte *)0x0) {
      operator_delete__(local_d8);
    }
    if (local_58 != (byte *)0x0) {
      operator_delete__(local_58);
    }
    if (local_e0 != (byte *)0x0) {
      operator_delete__(local_e0);
    }
    if (local_60 != (byte *)0x0) {
      operator_delete__(local_60);
    }
    if (local_e8 != (byte *)0x0) {
      operator_delete__(local_e8);
    }
    if (local_70 != (byte *)0x0) {
      operator_delete__(local_70);
    }
    if (local_f8 != (byte *)0x0) {
      operator_delete__(local_f8);
    }
    local_4 = local_24;
    gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
    gr::GrBufferIStream::~GrBufferIStream(in_stack_fffffffffffff2e0);
  }
  return local_4;
}

Assistant:

int CompareFontTables(TestCase * ptcase, GrcRtFileFont * pfontBmark, GrcRtFileFont * pfontTest)
{
	int ec = 0; // error count

	// benchmark font buffers
	const gr::byte * pHeadTblB; const gr::byte * pCmapTblB; const gr::byte * pSileTblB; const gr::byte * pSilfTblB;
	const gr::byte * pFeatTblB; const gr::byte * pGlatTblB; const gr::byte * pGlocTblB; const gr::byte * pNameTblB; const gr::byte * pSillTblB;
	size_t cbHeadSzB, cbCmapSzB, /*cbSileSzB,*/ cbSilfSzB, cbFeatSzB, cbGlatSzB, cbGlocSzB, cbNameSzB, cbSillSzB;
	// test font buffers
	const gr::byte * pHeadTblT; const gr::byte * pCmapTblT; const gr::byte * pSileTblT; const gr::byte * pSilfTblT;
	const gr::byte * pFeatTblT; const gr::byte * pGlatTblT; const gr::byte * pGlocTblT; const gr::byte * pNameTblT; const gr::byte * pSillTblT;
	size_t cbHeadSzT, cbCmapSzT, /*cbSileSzT,*/ cbSilfSzT, cbFeatSzT, cbGlatSzT, cbGlocSzT, cbNameSzT, cbSillSzT;

	// head table
	try {
		pHeadTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzB));
		if (pHeadTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty head table");
		else
		{
			try {
				pHeadTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty head table");
				else
				{
					if (cbHeadSzB != cbHeadSzT)
						OutputError(ec, ptcase, "ERROR: size of head tables do not match");
					if (TtfUtil::DesignUnits(pHeadTblB) != TtfUtil::DesignUnits(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: design units do not match");
					if (TtfUtil::IsItalic(pHeadTblB) != TtfUtil::IsItalic(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: italic flags do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR, could not read test font head table");
				pHeadTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font head table");
		pHeadTblB = NULL;
		pHeadTblT = NULL;
	}

	// TODO: handle Sile table.
	pSileTblB = NULL;
	pSileTblT = NULL;

	// cmap

	try {
		pCmapTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzB));
		if (pCmapTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty cmap table");
		else
		{
			try {
				pCmapTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty cmap table");
				else
				{
					if (cbCmapSzB != cbCmapSzT)
						OutputError(ec, ptcase, "ERROR: size of cmap tables do not match");
					// TBD: do we need to test the contents of the cmap?
					// The Graphite compiler shouldn't be changing it.
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font cmap table");
				pCmapTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font cmap table");
		pCmapTblB = NULL;
		pCmapTblT = NULL;
	}

	// name

	// Currently the only stuff we're getting from the name table are our feature names,
	// so use the version from the Graphite font (not the base font if any).
	//////if (m_fUseSepBase)
	//////	pgg->SetupGraphics(&chrpOriginal);

	// name - need feature names later
	try {
        pNameTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzB));
		if (pNameTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty name table");
		else
		{
			try {
				pNameTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzT));
				if (pNameTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty name table");
				else
				{
					if (cbNameSzB != cbNameSzT)
						OutputError(ec, ptcase, "ERROR: size of name tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font name table");
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font name table");
	}

	/****
	Obtain font name from InitNew() now instead of reading from font file. InitNew should
	should have a correct font name passed to it since it should come from a font registered
	by GrFontInst.exe. This commented code could be use to verify name in font file matches.
	NOTE: if we ever use this code again, make sure we're using the base font name table,
	not the Graphite wrapper font name table.
	// find the font family name
	if (!TtfUtil::Get31EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
	{	// use Name table which is Symbol encode instead
		// this could cause problems if a real Symbol writing system is used in the name table
		// however normally real Unicode values are used instead a Symbol writing system
		if (!TtfUtil::Get30EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
		{
			ReturnResult(kresFail);
		}
		// test for Symbol writing system. first byte of Unicode id should be 0xF0
		if (vbName[lnNameOff + 1] == (unsigned char)0xF0) // 1 - Unicode id is big endian
			ReturnResult(kresFail);
	}
	if (!TtfUtil::SwapWString(vbName.Begin() + lnNameOff, lnNameSz / sizeof(utf16)))
		ReturnResult(kresFail);

	m_stuFaceName = std::wstring((utf16 *)(vbName.begin() + lnNameOff), lnNameSz / sizeof(utf16));
	****/

	// Silf
	try {
		pSilfTblT = NULL;
		if ((pSilfTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Silf table");
		else
		{
			try {
				if ((pSilfTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Silf table");
				else
				{
					if (cbSilfSzB != cbSilfSzT)
						OutputError(ec, ptcase, "ERROR: size of Silf tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Silf table");
				pSilfTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Silf table");
		pSilfTblB = NULL;
		pSilfTblT = NULL;
	}

	// Feat
	try {
		if ((pFeatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Feat table");
		else
		{
			try {
				if ((pFeatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Feat table");
				else
				{
					if (cbFeatSzB != cbFeatSzT)
						OutputError(ec, ptcase, "ERROR: size of Feat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Feat table");
				pFeatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Feat table");
		pFeatTblB = NULL;
		pFeatTblT = NULL;
	}


	// Glat
	try {
		if ((pGlatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Glat table");
		else
		{
			try {
				if ((pGlatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Glat table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Glat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Glat table");
				pGlocTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Glat table");
		pGlocTblB = NULL;
		pGlocTblT = NULL;
	}

	// Gloc
	try {
		if ((pGlocTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Gloc table");
		else
		{
			try {
				if ((pGlocTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Gloc table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Gloc tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Gloc table");
				pGlatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Gloc table");
		pGlatTblB = NULL;
		pGlatTblT = NULL;
	}

	// Sill
	try {
		pSillTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzB));
		try {
			pSillTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzT));
			if (cbSillSzB != cbSillSzT)
				OutputError(ec, ptcase, "ERROR: size of Sill tables do not match");
		}
		catch (...)
		{
			OutputError(ec, ptcase, "ERROR: in attempting to read test font Sill table");
			pSillTblT = NULL;
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: in attempting to read benchmark font Sill table");
		pSillTblB = NULL;
		pSillTblT = NULL;
	}

	if (pSilfTblT == NULL)
		return ec;
	Assert(pSilfTblB);

	GrBufferIStream grstrmB, grstrmT;
	grstrmB.OpenBuffer((gr::byte *)pSilfTblB, cbSilfSzB);
	grstrmT.OpenBuffer((gr::byte *)pSilfTblT, cbSilfSzT);
	int chwMaxGlyphID;
	CompareSilfTables(ec, ptcase, grstrmB, grstrmT, &chwMaxGlyphID);
	grstrmB.Close();
	grstrmT.Close();

	if (chwMaxGlyphID == -1)
	{
		int ecBogus;
		OutputError(ecBogus, ptcase, "[Skipping Gloc and Glat tables since max glyph IDs do not match]");
	}
	else if (pGlatTblB && pGlocTblB && pGlatTblT && pGlocTblT)
	{
		GrBufferIStream grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT;
		grstrmGlatB.OpenBuffer((gr::byte *)pGlatTblB, cbGlatSzB);
		grstrmGlocB.OpenBuffer((gr::byte *)pGlocTblB, cbGlocSzB);
		grstrmGlatT.OpenBuffer((gr::byte *)pGlatTblT, cbGlatSzT);
		grstrmGlocT.OpenBuffer((gr::byte *)pGlocTblT, cbGlocSzT);
		CompareGlatAndGlocTables(ec, ptcase, chwMaxGlyphID, grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT);
		grstrmGlatB.Close();
		grstrmGlocB.Close();
		grstrmGlatT.Close();
		grstrmGlocT.Close();
	}

	if (pFeatTblB && pFeatTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pFeatTblB, cbFeatSzB);
		grstrmT.OpenBuffer((gr::byte *)pFeatTblT, cbFeatSzT);
		CompareFeatTables(ec, ptcase, grstrmB, grstrmT, (gr::byte*)pNameTblB, (gr::byte*)pNameTblT);
		grstrmB.Close();
		grstrmT.Close();
	}

	if (pSillTblB && pSillTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pSillTblB, cbSillSzB);
		grstrmT.OpenBuffer((gr::byte *)pSillTblT, cbSillSzT);
		CompareSillTables(ec, ptcase, grstrmB, grstrmT);
		grstrmB.Close();
		grstrmT.Close();
	}

	delete[] pHeadTblB;
	delete[] pHeadTblT;

	delete[] pCmapTblB;
	delete[] pCmapTblT;

	delete[] pNameTblB;
	delete[] pNameTblT;

	delete[] pSilfTblB;
	delete[] pSilfTblT;

	delete[] pFeatTblB;
	delete[] pFeatTblT;

	delete[] pGlatTblB;
	delete[] pGlatTblT;

	delete[] pGlocTblB;
	delete[] pGlocTblT;

	delete[] pSillTblB;
	delete[] pSillTblT;

	return ec;
}